

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O3

size_t io::
       read_all<io::posix::file,io::net::dynamic_vector_buffer<unsigned_char,std::allocator<unsigned_char>>,void>
                 (file *stream,
                 dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_> *b,
                 error_code *ec)

{
  size_t sVar1;
  error_category *peVar2;
  error_code local_28;
  
  sVar1 = net::
          read<io::posix::file,io::net::dynamic_vector_buffer<unsigned_char,std::allocator<unsigned_char>>,io::net::transfer_all,void>
                    ();
  std::error_code::error_code<io::net::stream_errc,void>(&local_28,eof);
  if ((ec->_M_cat == local_28._M_cat) && (ec->_M_value == local_28._M_value)) {
    peVar2 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
    ec->_M_cat = peVar2;
  }
  return sVar1;
}

Assistant:

std::size_t read_all(SyncReadStream& stream, DynamicBuffer&& b, std::error_code& ec)
{
    std::size_t bytes_read = io::read(stream, std::forward<DynamicBuffer>(b), ec);
    if (ec == stream_errc::eof) {
        ec.clear();
    }
    return bytes_read;
}